

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

void * utf8casestr(void *haystack,void *needle)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  char *h;
  byte *pbVar6;
  byte bVar7;
  byte bVar8;
  
  if (*needle != '\0') {
    cVar1 = *haystack;
    while (cVar1 != '\0') {
      lVar4 = (long)haystack + -1;
      pbVar6 = (byte *)needle;
      do {
        lVar5 = lVar4;
        bVar2 = *(byte *)(lVar5 + 1);
        bVar3 = *pbVar6;
        bVar7 = bVar2 | 0x20;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          bVar7 = bVar2;
        }
        bVar8 = bVar3 | 0x20;
        if (0x19 < (byte)(bVar3 + 0xbf)) {
          bVar8 = bVar3;
        }
        pbVar6 = pbVar6 + 1;
        lVar4 = lVar5 + 1;
      } while (bVar7 == bVar8);
      if (bVar3 == 0) {
        return haystack;
      }
      if (bVar2 == 0) break;
      haystack = (void *)(lVar5 + 2);
      cVar1 = *(char *)(lVar5 + 2);
    }
    haystack = (void *)0x0;
  }
  return haystack;
}

Assistant:

void *utf8casestr(const void *haystack, const void *needle) {
  const char *h = (const char *)haystack;

  // if needle has no utf8 codepoints before the null terminating
  // byte then return haystack
  if ('\0' == *((const char *)needle)) {
    return (void *)haystack;
  }

  while ('\0' != *h) {
    const char *maybeMatch = h;
    const char *n = (const char *)needle;

    for (;;) {
      char a = *h;
      char b = *n;
      // not entirely correct, but good enough
      if (('A' <= a) && ('Z' >= a)) {
        a |= 0x20; // make a lowercase
      }

      if (('A' <= b) && ('Z' >= b)) {
        b |= 0x20; // make b lowercase
      }

      // if we find a mismatch, bail out!
      if (a != b) {
        break;
      }

      n++;
      h++;
    }

    if ('\0' == *n) {
      // we found the whole utf8 string for needle in haystack at
      // maybeMatch, so return it
      return (void *)maybeMatch;
    } else {
      // h could be in the middle of an unmatching utf8 codepoint,
      // so we need to march it on to the next character beginning,
      if ('\0' != *h) {
        do {
          h++;
        } while (0x80 == (0xc0 & *h));
      }
    }
  }

  // no match
  return 0;
}